

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  secp256k1_modinv64_modinfo *psVar5;
  ulong uVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  secp256k1_modinv64_signed62 *psVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  secp256k1_fe *psVar14;
  ulong uVar15;
  secp256k1_fe *psVar16;
  uint uVar17;
  ulong uVar18;
  ulong *extraout_RDX;
  long lVar19;
  long lVar20;
  long lVar21;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  int iVar22;
  secp256k1_fe *psVar23;
  secp256k1_fe *psVar24;
  long lVar25;
  secp256k1_fe *unaff_RBP;
  secp256k1_fe *a_01;
  ulong uVar26;
  secp256k1_modinv64_signed62 *psVar27;
  secp256k1_modinv64_signed62 *psVar28;
  secp256k1_fe *psVar29;
  secp256k1_fe *a_02;
  secp256k1_fe *psVar30;
  secp256k1_modinv64_signed62 *a_03;
  secp256k1_modinv64_modinfo *psVar31;
  ulong uVar32;
  uint64_t *puVar33;
  uint64_t uVar34;
  secp256k1_fe *psVar35;
  undefined1 *puVar36;
  long lVar37;
  long lVar38;
  secp256k1_modinv64_modinfo *psVar39;
  secp256k1_modinv64_modinfo *psVar40;
  secp256k1_modinv64_modinfo *modinfo;
  long lVar41;
  long lVar42;
  secp256k1_fe *psVar43;
  secp256k1_fe *psVar44;
  bool bVar45;
  bool bVar46;
  secp256k1_modinv64_signed62 sStack_270;
  secp256k1_modinv64_signed62 sStack_248;
  secp256k1_fe *psStack_220;
  secp256k1_fe *psStack_218;
  secp256k1_fe *psStack_210;
  ulong uStack_208;
  secp256k1_fe *psStack_200;
  ulong uStack_1f8;
  secp256k1_fe *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  long lStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  uint64_t uStack_1c0;
  secp256k1_fe *psStack_1b8;
  secp256k1_fe *psStack_1b0;
  secp256k1_fe *psStack_1a8;
  secp256k1_fe *psStack_1a0;
  uint64_t uStack_198;
  secp256k1_fe *psStack_190;
  secp256k1_fe *psStack_188;
  secp256k1_fe *psStack_180;
  secp256k1_modinv64_modinfo *psStack_178;
  secp256k1_fe *psStack_170;
  secp256k1_fe *psStack_168;
  long lStack_160;
  secp256k1_fe *psStack_158;
  secp256k1_fe *psStack_150;
  ulong uStack_148;
  uint uStack_13c;
  undefined1 auStack_138 [48];
  secp256k1_modinv64_modinfo *psStack_108;
  secp256k1_fe *psStack_100;
  secp256k1_fe sStack_f8;
  secp256k1_modinv64_trans2x2 sStack_c8;
  secp256k1_fe sStack_a8;
  secp256k1_modinv64_signed62 sStack_78;
  undefined8 uStack_50;
  
  psVar43 = a;
  secp256k1_fe_verify(r);
  psVar29 = a;
  secp256k1_fe_verify(a);
  iVar4 = a->magnitude + r->magnitude;
  if (iVar4 < 0x21) {
    r->n[0] = r->n[0] + a->n[0];
    r->n[1] = r->n[1] + a->n[1];
    r->n[2] = r->n[2] + a->n[2];
    r->n[3] = r->n[3] + a->n[3];
    r->n[4] = r->n[4] + a->n[4];
    r->magnitude = iVar4;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_add_cold_1();
  uVar15 = psVar43->n[1];
  uVar26 = psVar43->n[2];
  uVar9 = psVar43->n[3];
  bVar46 = uVar9 != 0xffffffffffffffff;
  bVar45 = 0xbaaedce6af48a03a < uVar15;
  uStack_50 = CONCAT71((int7)((ulong)r >> 8),bVar45);
  psStack_108 = (secp256k1_modinv64_modinfo *)psVar43->n[0];
  if ((psStack_108 < (secp256k1_modinv64_modinfo *)0xbfd25e8cd0364141 ||
      ((uVar26 < 0xfffffffffffffffe || bVar46) || !bVar45)) &&
      ((uVar15 < 0xbaaedce6af48a03c || ((uVar26 < 0xfffffffffffffffe || bVar46) || !bVar45)) &&
      (uVar26 != 0xffffffffffffffff || bVar46))) {
    psVar29->n[0] = (ulong)psStack_108 & 0x3fffffffffffffff;
    psVar29->n[1] = (uVar15 & 0xfffffffffffffff) << 2 | (ulong)psStack_108 >> 0x3e;
    psVar29->n[2] = (uVar26 & 0x3ffffffffffffff) << 4 | uVar15 >> 0x3c;
    psVar29->n[3] = (uVar9 & 0xffffffffffffff) << 6 | uVar26 >> 0x3a;
    psVar29->n[4] = uVar9 >> 0x38;
    return;
  }
  secp256k1_scalar_to_signed62_cold_1();
  sStack_a8.n[2] = 0;
  sStack_a8.n[3] = 0;
  sStack_a8.n[0] = 0;
  sStack_a8.n[1] = 0;
  psVar43 = (secp256k1_fe *)0x0;
  sStack_a8.n[4] = 0;
  sStack_78.v[1] = 0;
  sStack_78.v[4] = 0;
  sStack_78.v[2] = 0;
  sStack_78.v[3] = 0;
  sStack_78.v[0] = 1;
  auStack_138._32_8_ = (psStack_108->modulus).v[4];
  auStack_138._0_8_ = (psStack_108->modulus).v[0];
  auStack_138._8_8_ = (psStack_108->modulus).v[1];
  auStack_138._16_8_ = (psStack_108->modulus).v[2];
  auStack_138._24_8_ = (psStack_108->modulus).v[3];
  sStack_f8.n[4] = psVar29->n[4];
  sStack_f8.n[0] = psVar29->n[0];
  sStack_f8.n[1] = psVar29->n[1];
  sStack_f8.n[2] = psVar29->n[2];
  sStack_f8.n[3] = psVar29->n[3];
  lVar42 = -1;
  psVar23 = (secp256k1_fe *)0x5;
  psVar40 = psStack_108;
  auStack_138._40_8_ = psVar29;
  do {
    modinfo = psStack_108;
    psVar29 = (secp256k1_fe *)auStack_138._0_8_;
    uStack_13c = (uint)psVar23;
    psVar5 = (secp256k1_modinv64_modinfo *)0x0;
    psVar16 = (secp256k1_fe *)0x0;
    psVar31 = (secp256k1_modinv64_modinfo *)0x1;
    uVar17 = 0x3e;
    a_01 = (secp256k1_fe *)0x1;
    uVar34 = sStack_f8.n[0];
    psVar30 = (secp256k1_fe *)auStack_138._0_8_;
    while( true ) {
      a_02 = (secp256k1_fe *)(-1L << ((byte)uVar17 & 0x3f) | uVar34);
      psVar14 = (secp256k1_fe *)0x0;
      if (a_02 != (secp256k1_fe *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar14 & 1) == 0;
            psVar14 = (secp256k1_fe *)((long)psVar14->n + 1)) {
        }
      }
      bVar11 = (byte)psVar14;
      psVar35 = (secp256k1_fe *)(uVar34 >> (bVar11 & 0x3f));
      a_01 = (secp256k1_fe *)((long)a_01 << (bVar11 & 0x3f));
      psVar5 = (secp256k1_modinv64_modinfo *)((long)psVar5 << (bVar11 & 0x3f));
      lVar42 = lVar42 - (long)psVar14;
      uVar17 = uVar17 - (int)psVar14;
      psStack_100 = psVar43;
      if (uVar17 == 0) break;
      if (((ulong)psVar30 & 1) == 0) {
        psStack_150 = (secp256k1_fe *)0x146910;
        secp256k1_modinv64_var_cold_8();
LAB_00146910:
        psStack_150 = (secp256k1_fe *)0x146915;
        secp256k1_modinv64_var_cold_7();
LAB_00146915:
        psStack_150 = (secp256k1_fe *)0x14691a;
        secp256k1_modinv64_var_cold_1();
LAB_0014691a:
        psStack_150 = (secp256k1_fe *)0x14691f;
        secp256k1_modinv64_var_cold_2();
LAB_0014691f:
        psStack_150 = (secp256k1_fe *)0x146924;
        secp256k1_modinv64_var_cold_6();
        psVar35 = psVar30;
        goto LAB_00146924;
      }
      if (((ulong)psVar35 & 1) == 0) goto LAB_00146910;
      a_02 = (secp256k1_fe *)((long)psVar5 * sStack_f8.n[0] + (long)a_01 * auStack_138._0_8_);
      psVar14 = (secp256k1_fe *)(ulong)(0x3e - uVar17);
      bVar11 = (byte)(0x3e - uVar17);
      psVar23 = (secp256k1_fe *)((long)psVar30 << (bVar11 & 0x3f));
      if (a_02 != psVar23) goto LAB_00146915;
      psVar23 = (secp256k1_fe *)((long)psVar31 * sStack_f8.n[0] + (long)psVar16 * auStack_138._0_8_)
      ;
      a_02 = (secp256k1_fe *)((long)psVar35 << (bVar11 & 0x3f));
      if (psVar23 != a_02) goto LAB_0014691a;
      psVar14 = (secp256k1_fe *)(lVar42 - 0x2ea);
      if (psVar14 < (secp256k1_fe *)0xfffffffffffffa2d) goto LAB_0014691f;
      iVar4 = (int)psVar35;
      if (lVar42 < 0) {
        lVar42 = -lVar42;
        uVar12 = (int)lVar42 + 1;
        if ((int)uVar17 <= (int)uVar12) {
          uVar12 = uVar17;
        }
        psVar14 = (secp256k1_fe *)(ulong)uVar12;
        a_02 = (secp256k1_fe *)(ulong)(uVar12 - 0x3f);
        if (0xffffffc1 < uVar12 - 0x3f) {
          psVar39 = (secp256k1_modinv64_modinfo *)-(long)psVar5;
          unaff_RBP = (secp256k1_fe *)-(long)a_01;
          psVar14 = (secp256k1_fe *)-(long)psVar30;
          psVar23 = (secp256k1_fe *)
                    ((ulong)(0x3fL << (-(char)uVar12 & 0x3fU)) >> (-(char)uVar12 & 0x3fU));
          uVar12 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)psVar14 & (uint)psVar23;
          psVar5 = psVar31;
          a_01 = psVar16;
          psVar40 = psVar39;
          goto LAB_001465cd;
        }
        goto LAB_0014692e;
      }
      uVar12 = (int)lVar42 + 1;
      if ((int)uVar17 <= (int)uVar12) {
        uVar12 = uVar17;
      }
      psVar14 = (secp256k1_fe *)(ulong)uVar12;
      a_02 = (secp256k1_fe *)(ulong)(uVar12 - 0x3f);
      if (uVar12 - 0x3f < 0xffffffc2) goto LAB_00146929;
      psVar23 = (secp256k1_fe *)
                ((ulong)(0xfL << (-(char)uVar12 & 0x3fU)) >> (-(char)uVar12 & 0x3fU));
      uVar12 = -(iVar4 * (((int)psVar30 * 2 + 2U & 8) + (int)psVar30)) & (uint)psVar23;
      unaff_RBP = psVar16;
      psVar39 = psVar31;
      psVar14 = psVar35;
      psVar35 = psVar30;
LAB_001465cd:
      uVar15 = (ulong)uVar12;
      a_02 = (secp256k1_fe *)(uVar15 * (long)psVar35);
      uVar34 = (long)a_02->n + (long)psVar14->n;
      psVar16 = (secp256k1_fe *)((long)unaff_RBP->n + (long)a_01 * uVar15);
      psVar14 = (secp256k1_fe *)(uVar15 * (long)psVar5);
      psVar31 = (secp256k1_modinv64_modinfo *)((long)psVar14->n + (long)&psVar39->modulus);
      psVar30 = psVar35;
      if ((uVar34 & (ulong)psVar23) != 0) {
LAB_00146924:
        psStack_150 = (secp256k1_fe *)0x146929;
        secp256k1_modinv64_var_cold_4();
        psVar30 = psVar35;
LAB_00146929:
        psStack_150 = (secp256k1_fe *)0x14692e;
        secp256k1_modinv64_var_cold_3();
LAB_0014692e:
        psStack_150 = (secp256k1_fe *)0x146933;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00146933;
      }
    }
    a_02 = (secp256k1_fe *)((long)psVar5 * (long)psVar16);
    psVar14 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar16),8);
    sStack_c8.u = (int64_t)a_01;
    sStack_c8.v = (int64_t)psVar5;
    sStack_c8.q = (int64_t)psVar16;
    sStack_c8.r = (int64_t)psVar31;
    if ((long)a_01 * (long)psVar31 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_01) * SEXT816((long)psVar31),8) - (long)psVar14 !=
        (ulong)((secp256k1_fe *)((long)a_01 * (long)psVar31) < a_02)) {
LAB_00146933:
      psStack_150 = (secp256k1_fe *)0x146938;
      secp256k1_modinv64_var_cold_9();
      modinfo = psVar40;
LAB_00146938:
      psStack_150 = (secp256k1_fe *)0x14693d;
      secp256k1_modinv64_var_cold_20();
LAB_0014693d:
      psStack_150 = (secp256k1_fe *)0x146942;
      secp256k1_modinv64_var_cold_19();
LAB_00146942:
      psStack_150 = (secp256k1_fe *)0x146947;
      secp256k1_modinv64_var_cold_18();
      psVar43 = psVar29;
LAB_00146947:
      psStack_150 = (secp256k1_fe *)0x14694c;
      secp256k1_modinv64_var_cold_17();
LAB_0014694c:
      psStack_150 = (secp256k1_fe *)0x146951;
      secp256k1_modinv64_var_cold_14();
LAB_00146951:
      psStack_150 = (secp256k1_fe *)0x146956;
      secp256k1_modinv64_var_cold_13();
LAB_00146956:
      psStack_150 = (secp256k1_fe *)0x14695b;
      secp256k1_modinv64_var_cold_12();
LAB_0014695b:
      psStack_150 = (secp256k1_fe *)0x146960;
      secp256k1_modinv64_var_cold_11();
LAB_00146960:
      psStack_150 = (secp256k1_fe *)0x146965;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00146965;
    }
    psStack_150 = (secp256k1_fe *)0x14665b;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)&sStack_a8,&sStack_78,&sStack_c8,psStack_108);
    uVar17 = uStack_13c;
    psVar30 = (secp256k1_fe *)auStack_138;
    psVar23 = (secp256k1_fe *)(ulong)uStack_13c;
    a_01 = (secp256k1_fe *)(ulong)uStack_13c;
    psVar14 = (secp256k1_fe *)0xffffffffffffffff;
    psStack_150 = (secp256k1_fe *)0x146678;
    a_02 = psVar30;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar30,uStack_13c,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_00146938;
    psVar14 = (secp256k1_fe *)0x1;
    a_01 = (secp256k1_fe *)(ulong)uVar17;
    psStack_150 = (secp256k1_fe *)0x146692;
    a_02 = psVar30;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar30,uVar17,&modinfo->modulus,1);
    if (0 < iVar4) goto LAB_0014693d;
    psVar29 = &sStack_f8;
    a_01 = (secp256k1_fe *)(ulong)uVar17;
    psVar14 = (secp256k1_fe *)0xffffffffffffffff;
    psStack_150 = (secp256k1_fe *)0x1466b3;
    a_02 = psVar29;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,uVar17,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_00146942;
    psVar14 = (secp256k1_fe *)0x1;
    a_01 = (secp256k1_fe *)(ulong)uVar17;
    psStack_150 = (secp256k1_fe *)0x1466cd;
    a_02 = psVar29;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,uVar17,&modinfo->modulus,1);
    psVar43 = psVar29;
    if (-1 < iVar4) goto LAB_00146947;
    psStack_150 = (secp256k1_fe *)0x1466ea;
    secp256k1_modinv64_update_fg_62_var
              (uVar17,(secp256k1_modinv64_signed62 *)psVar30,(secp256k1_modinv64_signed62 *)psVar29,
               &sStack_c8);
    psVar43 = psStack_100;
    if (sStack_f8.n[0] != 0) {
LAB_001466fb:
      lVar19 = (long)(int)uVar17;
      uVar15 = *(ulong *)(&stack0xfffffffffffffec0 + lVar19 * 8);
      psVar14 = (&psStack_100)[lVar19];
      a_02 = (secp256k1_fe *)((long)uVar15 >> 0x3f ^ uVar15 | lVar19 + -2 >> 0x3f);
      a_01 = (secp256k1_fe *)((long)psVar14 >> 0x3f ^ (ulong)psVar14 | (ulong)a_02);
      if (a_01 == (secp256k1_fe *)0x0) {
        psVar23 = (secp256k1_fe *)(ulong)(uVar17 - 1);
        (&uStack_148)[lVar19] = (&uStack_148)[lVar19] | uVar15 << 0x3e;
        psVar14 = (secp256k1_fe *)((long)psVar14 << 0x3e);
        (&psStack_108)[lVar19] =
             (secp256k1_modinv64_modinfo *)((ulong)(&psStack_108)[lVar19] | (ulong)psVar14);
      }
      if (10 < (int)psVar43) goto LAB_0014694c;
      psVar14 = (secp256k1_fe *)0xffffffffffffffff;
      psStack_150 = (secp256k1_fe *)0x14675d;
      iVar22 = (int)psVar23;
      a_01 = psVar23;
      a_02 = psVar30;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar30,iVar22,&modinfo->modulus,-1);
      if (iVar4 < 1) goto LAB_00146951;
      psVar14 = (secp256k1_fe *)0x1;
      psStack_150 = (secp256k1_fe *)0x146777;
      a_01 = psVar23;
      a_02 = psVar30;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar30,iVar22,&modinfo->modulus,1);
      if (0 < iVar4) goto LAB_00146956;
      psVar30 = &sStack_f8;
      psVar14 = (secp256k1_fe *)0xffffffffffffffff;
      psStack_150 = (secp256k1_fe *)0x146798;
      a_01 = psVar23;
      a_02 = psVar30;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar30,iVar22,&modinfo->modulus,-1);
      if (iVar4 < 1) goto LAB_0014695b;
      psVar14 = (secp256k1_fe *)0x1;
      psStack_150 = (secp256k1_fe *)0x1467b2;
      a_01 = psVar23;
      a_02 = psVar30;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar30,iVar22,&modinfo->modulus,1);
      if (iVar4 < 0) {
        bVar45 = true;
        psVar43 = (secp256k1_fe *)(ulong)((int)psVar43 + 1);
        goto LAB_001467e7;
      }
      goto LAB_00146960;
    }
    if (1 < (int)uVar17) {
      uVar15 = 1;
      uVar26 = 0;
      do {
        uVar26 = uVar26 | sStack_f8.n[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
      if (uVar26 != 0) goto LAB_001466fb;
    }
    bVar45 = false;
LAB_001467e7:
    psVar40 = modinfo;
  } while (bVar45);
  a_02 = &sStack_f8;
  iVar22 = (int)psVar23;
  psVar14 = (secp256k1_fe *)0x0;
  psStack_150 = (secp256k1_fe *)0x146804;
  a_01 = psVar23;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,iVar22,&SECP256K1_SIGNED62_ONE,0);
  if (iVar4 == 0) {
    psStack_150 = (secp256k1_fe *)0x146826;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_138,iVar22,&SECP256K1_SIGNED62_ONE,-1)
    ;
    psVar43 = (secp256k1_fe *)auStack_138._40_8_;
    if (iVar4 == 0) {
LAB_001468c6:
      psStack_150 = (secp256k1_fe *)0x1468e1;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)&sStack_a8,
                 *(int64_t *)(&stack0xfffffffffffffec0 + (long)iVar22 * 8),modinfo);
      psVar43->n[4] = sStack_a8.n[4];
      psVar43->n[2] = sStack_a8.n[2];
      psVar43->n[3] = sStack_a8.n[3];
      *psVar43->n = sStack_a8.n[0];
      psVar43->n[1] = sStack_a8.n[1];
      return;
    }
    psStack_150 = (secp256k1_fe *)0x14684b;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_138,iVar22,&SECP256K1_SIGNED62_ONE,1);
    if (iVar4 == 0) goto LAB_001468c6;
    a_01 = (secp256k1_fe *)0x5;
    psVar14 = (secp256k1_fe *)0x0;
    psStack_150 = (secp256k1_fe *)0x146865;
    a_02 = psVar43;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar43,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar4 == 0) {
      a_02 = &sStack_a8;
      a_01 = (secp256k1_fe *)0x5;
      psVar14 = (secp256k1_fe *)0x0;
      psStack_150 = (secp256k1_fe *)0x146888;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 == 0) {
        psStack_150 = (secp256k1_fe *)0x1468a4;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_138,iVar22,&modinfo->modulus,1);
        if (iVar4 == 0) goto LAB_001468c6;
        a_02 = (secp256k1_fe *)auStack_138;
        psVar14 = (secp256k1_fe *)0xffffffffffffffff;
        psStack_150 = (secp256k1_fe *)0x1468be;
        a_01 = psVar23;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,iVar22,&modinfo->modulus,-1);
        if (iVar4 == 0) goto LAB_001468c6;
      }
    }
  }
  else {
LAB_00146965:
    psStack_150 = (secp256k1_fe *)0x14696a;
    secp256k1_modinv64_var_cold_15();
  }
  psStack_150 = (secp256k1_fe *)secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  psStack_150 = psVar23;
  if (a_01->n[0] >> 0x3e == 0) {
    uVar15 = a_01->n[1];
    if (0x3fffffffffffffff < uVar15) goto LAB_00146a68;
    uVar26 = a_01->n[2];
    if (0x3fffffffffffffff < uVar26) goto LAB_00146a6d;
    uVar9 = a_01->n[3];
    if (0x3fffffffffffffff < uVar9) goto LAB_00146a72;
    psVar14 = (secp256k1_fe *)a_01->n[4];
    if ((secp256k1_fe *)0xff < psVar14) goto LAB_00146a77;
    uVar6 = uVar15 << 0x3e | a_01->n[0];
    uVar18 = uVar26 << 0x3c | uVar15 >> 2;
    uVar26 = uVar9 << 0x3a | uVar26 >> 4;
    uVar15 = (long)psVar14 << 0x38 | uVar9 >> 6;
    a_02->n[0] = uVar6;
    a_02->n[1] = uVar18;
    a_02->n[2] = uVar26;
    a_02->n[3] = uVar15;
    uVar17 = (uint)((0xfffffffffffffffd < uVar26 && uVar15 == 0xffffffffffffffff) &&
                   0xbaaedce6af48a03a < uVar18);
    uVar12 = 0;
    if (0xbaaedce6af48a03b < uVar18) {
      uVar12 = uVar17;
    }
    uVar12 = uVar12 | (uVar26 == 0xffffffffffffffff && uVar15 == 0xffffffffffffffff);
    a_01 = (secp256k1_fe *)(ulong)uVar12;
    a_02 = (secp256k1_fe *)0xbfd25e8cd0364140;
    uVar13 = 0;
    if (0xbfd25e8cd0364140 < uVar6) {
      uVar13 = uVar17;
    }
    uVar13 = uVar13 | uVar12;
    psVar14 = (secp256k1_fe *)(ulong)uVar13;
    psVar23 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar23 >> 8),0xbaaedce6af48a03a < uVar18);
    if (uVar13 == 0) {
      return;
    }
  }
  else {
    psStack_158 = (secp256k1_fe *)0x146a68;
    secp256k1_scalar_from_signed62_cold_6();
LAB_00146a68:
    psStack_158 = (secp256k1_fe *)0x146a6d;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00146a6d:
    psStack_158 = (secp256k1_fe *)0x146a72;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00146a72:
    psStack_158 = (secp256k1_fe *)0x146a77;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00146a77:
    psStack_158 = (secp256k1_fe *)0x146a7c;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_158 = (secp256k1_fe *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_158 = unaff_RBP;
  lStack_160 = lVar42;
  psStack_168 = psVar43;
  psStack_170 = psVar30;
  psStack_178 = modinfo;
  psStack_180 = psVar23;
  uVar34 = a_02->n[0];
  psStack_190 = (secp256k1_fe *)a_02->n[1];
  psStack_1a0 = (secp256k1_fe *)a_02->n[2];
  uStack_1c0 = a_02->n[3];
  psStack_1b0 = (secp256k1_fe *)a_02->n[4];
  psVar43 = (secp256k1_fe *)a_01->n[0];
  psStack_188 = (secp256k1_fe *)a_01->n[1];
  uStack_198 = a_01->n[2];
  uStack_1f8 = *extraout_RDX;
  psStack_1f0 = (secp256k1_fe *)extraout_RDX[1];
  uStack_208 = extraout_RDX[2];
  psStack_200 = (secp256k1_fe *)extraout_RDX[3];
  psVar29 = (secp256k1_fe *)a_01->n[3];
  psStack_1b8 = (secp256k1_fe *)a_01->n[4];
  psVar23 = (secp256k1_fe *)0x5;
  psVar16 = (secp256k1_fe *)0xfffffffffffffffe;
  psStack_210 = (secp256k1_fe *)0x146b1d;
  psVar30 = a_02;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar14,-2
                    );
  if (iVar4 < 1) {
    psStack_210 = (secp256k1_fe *)0x14763d;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014763d:
    psStack_210 = (secp256k1_fe *)0x147642;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00147642:
    psStack_210 = (secp256k1_fe *)0x147647;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00147647:
    psStack_210 = (secp256k1_fe *)0x14764c;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014764c:
    psStack_210 = (secp256k1_fe *)0x147651;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00147651:
    psStack_210 = (secp256k1_fe *)0x147656;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00147656:
    psStack_210 = (secp256k1_fe *)0x14765b;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014765b:
    psStack_210 = (secp256k1_fe *)0x147660;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar35 = psVar14;
LAB_00147660:
    psStack_210 = (secp256k1_fe *)0x147665;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00147665:
    psStack_210 = (secp256k1_fe *)0x14766a;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014766a:
    psStack_210 = (secp256k1_fe *)0x14766f;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar24 = psVar35;
LAB_0014766f:
    psStack_210 = (secp256k1_fe *)0x147674;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00147674:
    psStack_210 = (secp256k1_fe *)0x147679;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00147679:
    psStack_210 = (secp256k1_fe *)0x14767e;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014767e:
    psStack_210 = (secp256k1_fe *)0x147683;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00147683:
    psStack_210 = (secp256k1_fe *)0x147688;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00147688:
    psStack_210 = (secp256k1_fe *)0x14768d;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014768d:
    psStack_210 = (secp256k1_fe *)0x147692;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00147692:
    psStack_210 = (secp256k1_fe *)0x147697;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00147697:
    psStack_210 = (secp256k1_fe *)0x14769c;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014769c:
    psStack_210 = (secp256k1_fe *)0x1476a1;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001476a1:
    psVar29 = psVar43;
    a_01 = a_02;
    psStack_210 = (secp256k1_fe *)0x1476a6;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001476a6:
    psStack_210 = (secp256k1_fe *)0x1476ab;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_001476ab:
    psStack_210 = (secp256k1_fe *)0x1476b0;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_001476b0:
    psStack_210 = (secp256k1_fe *)0x1476b5;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_001476b5:
    psStack_210 = (secp256k1_fe *)0x1476ba;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_001476ba:
    psStack_210 = (secp256k1_fe *)0x1476bf;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_001476bf:
    psStack_210 = (secp256k1_fe *)0x1476c4;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = a_01;
    psVar44 = psVar29;
LAB_001476c4:
    psStack_210 = (secp256k1_fe *)0x1476c9;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001476c9:
    psStack_210 = (secp256k1_fe *)0x1476ce;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001476ce:
    psStack_210 = (secp256k1_fe *)0x1476d3;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001476d3:
    psVar35 = psVar16;
    psStack_210 = (secp256k1_fe *)0x1476d8;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001476d8:
    uVar17 = (uint)psVar23;
    psStack_210 = (secp256k1_fe *)0x1476dd;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar16 = (secp256k1_fe *)0x1;
    psVar23 = (secp256k1_fe *)0x5;
    psStack_210 = (secp256k1_fe *)0x146b3a;
    psVar30 = a_02;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar14,
                       1);
    if (-1 < iVar4) goto LAB_0014763d;
    psVar23 = (secp256k1_fe *)0x5;
    psVar16 = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_210 = (secp256k1_fe *)0x146b59;
    psVar30 = a_01;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar14,
                       -2);
    if (iVar4 < 1) goto LAB_00147642;
    psVar16 = (secp256k1_fe *)0x1;
    psVar23 = (secp256k1_fe *)0x5;
    psStack_210 = (secp256k1_fe *)0x146b76;
    psVar30 = a_01;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar14,
                       1);
    if (-1 < iVar4) goto LAB_00147647;
    psStack_210 = (secp256k1_fe *)0x146b9c;
    psStack_1d0 = a_02;
    psStack_1a8 = psVar29;
    iVar7 = secp256k1_modinv64_abs(uStack_1f8);
    psStack_210 = (secp256k1_fe *)0x146ba9;
    psVar30 = psStack_1f0;
    iVar8 = secp256k1_modinv64_abs((int64_t)psStack_1f0);
    psVar16 = (secp256k1_fe *)(0x4000000000000000 - iVar8);
    a_02 = (secp256k1_fe *)0x3fffffffffffffff;
    if ((long)psVar16 < iVar7) goto LAB_0014764c;
    psStack_210 = (secp256k1_fe *)0x146bc4;
    iVar7 = secp256k1_modinv64_abs(uStack_208);
    psStack_210 = (secp256k1_fe *)0x146bd1;
    psVar30 = psStack_200;
    iVar8 = secp256k1_modinv64_abs((int64_t)psStack_200);
    psVar29 = psStack_1d0;
    psVar16 = (secp256k1_fe *)(0x4000000000000000 - iVar8);
    if ((long)psVar16 < iVar7) goto LAB_00147651;
    a_02 = (secp256k1_fe *)0x7fffffffffffffff;
    psVar23 = (secp256k1_fe *)(uStack_1f8 * uVar34);
    psVar16 = SUB168(SEXT816((long)uStack_1f8) * SEXT816((long)uVar34),8);
    uVar15 = (long)psStack_1f0 * (long)psVar43;
    lVar19 = SUB168(SEXT816((long)psStack_1f0) * SEXT816((long)psVar43),8);
    lVar42 = (0x7fffffffffffffff - lVar19) - (long)psVar16;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar16) !=
        SBORROW8(lVar42,(ulong)((secp256k1_fe *)~uVar15 < psVar23))) !=
        (long)(lVar42 - (ulong)((secp256k1_fe *)~uVar15 < psVar23)) < 0) goto LAB_00147656;
    puVar33 = (uint64_t *)((long)psVar23->n + uVar15);
    lVar37 = (long)psVar16->n + (ulong)CARRY8(uVar15,(ulong)psVar23) + lVar19;
    uVar26 = uStack_208 * uVar34;
    lVar20 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)uVar34),8);
    uVar9 = (long)psStack_200 * (long)psVar43;
    lVar21 = SUB168(SEXT816((long)psStack_200) * SEXT816((long)psVar43),8);
    uVar15 = (ulong)(-uVar9 - 1 < uVar26);
    lVar42 = (0x7fffffffffffffff - lVar21) - lVar20;
    lVar19 = lVar42 - uVar15;
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar21,lVar20) != SBORROW8(lVar42,uVar15)) == lVar19 < 0
    ;
    psVar16 = (secp256k1_fe *)CONCAT71((int7)((ulong)lVar19 >> 8),lVar21 < 0 || bVar45);
    if (lVar21 >= 0 && !bVar45) goto LAB_0014765b;
    psVar35 = (secp256k1_fe *)((long)psStack_1b8 >> 0x3f);
    lStack_1e0 = ((ulong)psStack_1f0 & (ulong)psVar35) + (uStack_1f8 & (long)psStack_1b0 >> 0x3f);
    uVar6 = uVar9 + uVar26;
    psVar30 = (secp256k1_fe *)(lVar21 + lVar20 + (ulong)CARRY8(uVar9,uVar26));
    uVar34 = psVar14->n[0];
    psVar23 = *(secp256k1_fe **)&psVar14->magnitude;
    psVar16 = (secp256k1_fe *)0x3fffffffffffffff;
    lStack_1e0 = lStack_1e0 - ((long)psVar23 * (long)puVar33 + lStack_1e0 & 0x3fffffffffffffffU);
    uVar26 = lStack_1e0 * uVar34;
    lVar19 = SUB168(SEXT816(lStack_1e0) * SEXT816((long)uVar34),8);
    uVar15 = (ulong)((undefined1 *)(-uVar26 - 1) < puVar33);
    lVar42 = (0x7fffffffffffffff - lVar19) - lVar37;
    psVar43 = (secp256k1_fe *)((-0x8000000000000000 - lVar19) - (ulong)(uVar26 != 0));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar37) != SBORROW8(lVar42,uVar15)) ==
             (long)(lVar42 - uVar15) < 0;
    if (lVar19 < 0) {
      bVar45 = (SBORROW8(lVar37,(long)psVar43) !=
               SBORROW8(lVar37 - (long)psVar43,(ulong)(puVar33 < (undefined1 *)-uVar26))) ==
               (long)((lVar37 - (long)psVar43) - (ulong)(puVar33 < (undefined1 *)-uVar26)) < 0;
    }
    psStack_1d8 = a_01;
    psStack_1c8 = psVar14;
    if (!bVar45) goto LAB_00147660;
    lVar42 = ((ulong)psVar35 & (ulong)psStack_200) + ((long)psStack_1b0 >> 0x3f & uStack_208);
    psVar35 = (secp256k1_fe *)(lVar42 - ((long)psVar23 * uVar6 + lVar42 & 0x3fffffffffffffff));
    lVar20 = lVar19 + lVar37 + (ulong)CARRY8(uVar26,(ulong)puVar33);
    uVar9 = (long)psVar35 * uVar34;
    lVar19 = SUB168(SEXT816((long)psVar35) * SEXT816((long)uVar34),8);
    uVar15 = (ulong)(-uVar9 - 1 < uVar6);
    lVar42 = (0x7fffffffffffffff - lVar19) - (long)psVar30;
    psVar23 = (secp256k1_fe *)((-0x8000000000000000 - lVar19) - (ulong)(uVar9 != 0));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar30) != SBORROW8(lVar42,uVar15)) ==
             (long)(lVar42 - uVar15) < 0;
    if (lVar19 < 0) {
      bVar45 = (SBORROW8((long)psVar30,(long)psVar23) !=
               SBORROW8((long)psVar30 - (long)psVar23,(ulong)(uVar6 < -uVar9))) ==
               (long)(((long)psVar30 - (long)psVar23) - (ulong)(uVar6 < -uVar9)) < 0;
    }
    if (!bVar45) goto LAB_00147665;
    puVar36 = (undefined1 *)((long)psVar30->n + (ulong)CARRY8(uVar9,uVar6) + lVar19);
    if (((long)puVar33 + uVar26 & 0x3fffffffffffffff) != 0) goto LAB_0014766a;
    psVar24 = psVar35;
    if ((uVar9 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_0014766f;
    psVar24 = (secp256k1_fe *)0x8000000000000000;
    uVar15 = (ulong)((long)puVar33 + uVar26) >> 0x3e | lVar20 * 4;
    psVar16 = (secp256k1_fe *)0x7fffffffffffffff;
    uVar18 = uStack_1f8 * (long)psStack_190 + uVar15;
    psVar30 = (secp256k1_fe *)
              (SUB168(SEXT816((long)uStack_1f8) * SEXT816((long)psStack_190),8) + (lVar20 >> 0x3e) +
              (ulong)CARRY8(uStack_1f8 * (long)psStack_190,uVar15));
    uVar26 = (long)psStack_1f0 * (long)psStack_188;
    lVar20 = SUB168(SEXT816((long)psStack_1f0) * SEXT816((long)psStack_188),8);
    uVar15 = (ulong)(-uVar26 - 1 < uVar18);
    lVar42 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
    lVar21 = (-0x8000000000000000 - lVar20) - (ulong)(uVar26 != 0);
    lVar19 = (long)psVar30 - lVar21;
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar42,uVar15)) ==
             (long)(lVar42 - uVar15) < 0;
    if (lVar20 < 0) {
      bVar45 = (SBORROW8((long)psVar30,lVar21) != SBORROW8(lVar19,(ulong)(uVar18 < -uVar26))) ==
               (long)(lVar19 - (ulong)(uVar18 < -uVar26)) < 0;
    }
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    a_02 = psStack_190;
    psVar43 = psStack_188;
    psStack_1e8 = psVar35;
    if (bVar45 == false) goto LAB_00147674;
    uVar15 = uVar9 + uVar6 >> 0x3e | (long)puVar36 * 4;
    uVar9 = uVar18 + uVar26;
    psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)CARRY8(uVar18,uVar26) + lVar20);
    uVar6 = uStack_208 * (long)psStack_190 + uVar15;
    lVar21 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)psStack_190),8) +
             ((long)puVar36 >> 0x3e) + (ulong)CARRY8(uStack_208 * (long)psStack_190,uVar15);
    uVar26 = (long)psStack_200 * (long)psStack_188;
    lVar20 = SUB168(SEXT816((long)psStack_200) * SEXT816((long)psStack_188),8);
    uVar15 = (ulong)(-uVar26 - 1 < uVar6);
    lVar42 = (0x7fffffffffffffff - lVar20) - lVar21;
    lVar37 = (-0x8000000000000000 - lVar20) - (ulong)(uVar26 != 0);
    lVar19 = lVar21 - lVar37;
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar42,uVar15)) ==
             (long)(lVar42 - uVar15) < 0;
    if (lVar20 < 0) {
      bVar45 = (SBORROW8(lVar21,lVar37) != SBORROW8(lVar19,(ulong)(uVar6 < -uVar26))) ==
               (long)(lVar19 - (ulong)(uVar6 < -uVar26)) < 0;
    }
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    if (bVar45 == false) goto LAB_00147679;
    a_02 = (secp256k1_fe *)0x7fffffffffffffff;
    uVar15 = uVar6 + uVar26;
    lVar42 = lVar21 + lVar20 + (ulong)CARRY8(uVar6,uVar26);
    uVar34 = psVar14->n[1];
    if (uVar34 != 0) {
      uVar6 = uVar34 * lStack_1e0;
      lVar20 = SUB168(SEXT816((long)uVar34) * SEXT816(lStack_1e0),8);
      uVar26 = (ulong)(-uVar6 - 1 < uVar9);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
      psVar23 = (secp256k1_fe *)((-0x8000000000000000 - lVar20) - (ulong)(uVar6 != 0));
      bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
               (long)(lVar19 - uVar26) < 0;
      if (lVar20 < 0) {
        bVar45 = (SBORROW8((long)psVar30,(long)psVar23) !=
                 SBORROW8((long)psVar30 - (long)psVar23,(ulong)(uVar9 < -uVar6))) ==
                 (long)(((long)psVar30 - (long)psVar23) - (ulong)(uVar9 < -uVar6)) < 0;
      }
      psVar16 = psVar35;
      psVar44 = psStack_188;
      if (!bVar45) goto LAB_001476c4;
      uVar18 = uVar34 * (long)psVar35;
      lVar37 = SUB168(SEXT816((long)uVar34) * SEXT816((long)psVar35),8);
      uVar26 = (ulong)(-uVar18 - 1 < uVar15);
      lVar19 = (0x7fffffffffffffff - lVar37) - lVar42;
      lVar41 = (-0x8000000000000000 - lVar37) - (ulong)(uVar18 != 0);
      lVar21 = lVar42 - lVar41;
      psVar44 = (secp256k1_fe *)(lVar21 - (ulong)(uVar15 < -uVar18));
      bVar45 = (SBORROW8(0x7fffffffffffffff - lVar37,lVar42) != SBORROW8(lVar19,uVar26)) ==
               (long)(lVar19 - uVar26) < 0;
      if (lVar37 < 0) {
        bVar45 = (SBORROW8(lVar42,lVar41) != SBORROW8(lVar21,(ulong)(uVar15 < -uVar18))) ==
                 (long)psVar44 < 0;
      }
      psVar23 = (secp256k1_fe *)(ulong)bVar45;
      if (bVar45 != false) {
        bVar45 = CARRY8(uVar9,uVar6);
        uVar9 = uVar9 + uVar6;
        psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)bVar45 + lVar20);
        bVar45 = CARRY8(uVar15,uVar18);
        uVar15 = uVar15 + uVar18;
        lVar42 = lVar42 + lVar37 + (ulong)bVar45;
        goto LAB_00146f98;
      }
      goto LAB_001476c9;
    }
LAB_00146f98:
    uVar26 = (long)psVar30 << 2 | uVar9 >> 0x3e;
    uVar18 = uStack_1f8 * (long)psStack_1a0 + uVar26;
    psVar30 = (secp256k1_fe *)
              (((long)psVar30 >> 0x3e) +
               SUB168(SEXT816((long)uStack_1f8) * SEXT816((long)psStack_1a0),8) +
              (ulong)CARRY8(uStack_1f8 * (long)psStack_1a0,uVar26));
    uVar6 = (long)psStack_1f0 * uStack_198;
    lVar21 = SUB168(SEXT816((long)psStack_1f0) * SEXT816((long)uStack_198),8);
    uVar26 = (ulong)(-uVar6 - 1 < uVar18);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
    lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar6 != 0);
    lVar20 = (long)psVar30 - lVar37;
    psStack_1d0->n[0] = uVar9 & 0x3fffffffffffffff;
    a_01->n[0] = uVar15 & 0x3fffffffffffffff;
    bVar45 = (SBORROW8((long)psVar30,lVar37) != SBORROW8(lVar20,(ulong)(uVar18 < -uVar6))) ==
             (long)(lVar20 - (ulong)(uVar18 < -uVar6)) < 0;
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
             (long)(lVar19 - uVar26) < 0;
    if (lVar21 < 0) {
      bVar46 = bVar45;
    }
    psVar16 = psStack_1a0;
    psVar43 = psStack_1d0;
    if (!bVar46) goto LAB_0014767e;
    uVar15 = uVar15 >> 0x3e | lVar42 << 2;
    uVar32 = uVar18 + uVar6;
    psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)CARRY8(uVar18,uVar6) + lVar21);
    uVar9 = uStack_208 * (long)psStack_1a0 + uVar15;
    lVar20 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)psStack_1a0),8) + (lVar42 >> 0x3e) +
             (ulong)CARRY8(uStack_208 * (long)psStack_1a0,uVar15);
    uVar26 = (long)psStack_200 * uStack_198;
    lVar19 = SUB168(SEXT816((long)psStack_200) * SEXT816((long)uStack_198),8);
    uVar15 = (ulong)(-uVar26 - 1 < uVar9);
    lVar42 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar16 = (secp256k1_fe *)0x8000000000000000;
    psVar24 = (secp256k1_fe *)((-0x8000000000000000 - lVar19) - (ulong)(uVar26 != 0));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar42,uVar15)) ==
             (long)(lVar42 - uVar15) < 0;
    if (lVar19 < 0) {
      bVar45 = (SBORROW8(lVar20,(long)psVar24) !=
               SBORROW8(lVar20 - (long)psVar24,(ulong)(uVar9 < -uVar26))) ==
               (long)((lVar20 - (long)psVar24) - (ulong)(uVar9 < -uVar26)) < 0;
    }
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    if (bVar45 == false) goto LAB_00147683;
    uVar15 = uVar9 + uVar26;
    lVar42 = lVar20 + lVar19 + (ulong)CARRY8(uVar9,uVar26);
    uVar34 = psVar14->n[2];
    if (uVar34 != 0) {
      uVar9 = uVar34 * lStack_1e0;
      lVar20 = SUB168(SEXT816((long)uVar34) * SEXT816(lStack_1e0),8);
      uVar26 = (ulong)(-uVar9 - 1 < uVar32);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
      psVar23 = (secp256k1_fe *)((-0x8000000000000000 - lVar20) - (ulong)(uVar9 != 0));
      bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
               (long)(lVar19 - uVar26) < 0;
      if (lVar20 < 0) {
        bVar45 = (SBORROW8((long)psVar30,(long)psVar23) !=
                 SBORROW8((long)psVar30 - (long)psVar23,(ulong)(uVar32 < -uVar9))) ==
                 (long)(((long)psVar30 - (long)psVar23) - (ulong)(uVar32 < -uVar9)) < 0;
      }
      psVar44 = psStack_1d0;
      if (!bVar45) goto LAB_001476ce;
      uVar6 = uVar34 * (long)psVar35;
      lVar37 = SUB168(SEXT816((long)uVar34) * SEXT816((long)psVar35),8);
      uVar26 = (ulong)(-uVar6 - 1 < uVar15);
      lVar19 = (0x7fffffffffffffff - lVar37) - lVar42;
      lVar41 = (-0x8000000000000000 - lVar37) - (ulong)(uVar6 != 0);
      lVar21 = lVar42 - lVar41;
      psVar44 = (secp256k1_fe *)
                (ulong)((SBORROW8(lVar42,lVar41) != SBORROW8(lVar21,(ulong)(uVar15 < -uVar6))) ==
                       (long)(lVar21 - (ulong)(uVar15 < -uVar6)) < 0);
      psVar23 = (secp256k1_fe *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar37,lVar42) != SBORROW8(lVar19,uVar26)) ==
                       (long)(lVar19 - uVar26) < 0);
      if (lVar37 < 0) {
        psVar23 = psVar44;
      }
      if ((char)psVar23 != '\0') {
        bVar45 = CARRY8(uVar32,uVar9);
        uVar32 = uVar32 + uVar9;
        psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)bVar45 + lVar20);
        bVar45 = CARRY8(uVar15,uVar6);
        uVar15 = uVar15 + uVar6;
        lVar42 = lVar42 + lVar37 + (ulong)bVar45;
        goto LAB_00147192;
      }
      goto LAB_001476d3;
    }
LAB_00147192:
    a_02 = (secp256k1_fe *)0x8000000000000000;
    psVar24 = (secp256k1_fe *)0x7fffffffffffffff;
    uVar26 = (long)psVar30 << 2 | uVar32 >> 0x3e;
    uVar6 = uStack_1f8 * uStack_1c0 + uVar26;
    psVar30 = (secp256k1_fe *)
              (((long)psVar30 >> 0x3e) +
               SUB168(SEXT816((long)uStack_1f8) * SEXT816((long)uStack_1c0),8) +
              (ulong)CARRY8(uStack_1f8 * uStack_1c0,uVar26));
    uVar9 = (long)psStack_1f0 * (long)psStack_1a8;
    lVar21 = SUB168(SEXT816((long)psStack_1f0) * SEXT816((long)psStack_1a8),8);
    uVar26 = (ulong)(-uVar9 - 1 < uVar6);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
    lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar9 != 0);
    lVar20 = (long)psVar30 - lVar37;
    psStack_1d0->n[1] = uVar32 & 0x3fffffffffffffff;
    a_01->n[1] = uVar15 & 0x3fffffffffffffff;
    bVar45 = (SBORROW8((long)psVar30,lVar37) != SBORROW8(lVar20,(ulong)(uVar6 < -uVar9))) ==
             (long)(lVar20 - (ulong)(uVar6 < -uVar9)) < 0;
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
             (long)(lVar19 - uVar26) < 0;
    if (lVar21 < 0) {
      bVar46 = bVar45;
    }
    psVar16 = psStack_1a8;
    if (!bVar46) goto LAB_00147688;
    uVar15 = uVar15 >> 0x3e | lVar42 << 2;
    uVar18 = uVar6 + uVar9;
    psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)CARRY8(uVar6,uVar9) + lVar21);
    uVar9 = uStack_208 * uStack_1c0 + uVar15;
    lVar20 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)uStack_1c0),8) + (lVar42 >> 0x3e) +
             (ulong)CARRY8(uStack_208 * uStack_1c0,uVar15);
    uVar26 = (long)psStack_200 * (long)psStack_1a8;
    lVar19 = SUB168(SEXT816((long)psStack_200) * SEXT816((long)psStack_1a8),8);
    uVar15 = (ulong)(-uVar26 - 1 < uVar9);
    lVar42 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar24 = (secp256k1_fe *)(lVar42 - uVar15);
    psVar16 = (secp256k1_fe *)0x8000000000000000;
    a_02 = (secp256k1_fe *)((-0x8000000000000000 - lVar19) - (ulong)(uVar26 != 0));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar42,uVar15)) ==
             (long)psVar24 < 0;
    if (lVar19 < 0) {
      bVar45 = (SBORROW8(lVar20,(long)a_02) !=
               SBORROW8(lVar20 - (long)a_02,(ulong)(uVar9 < -uVar26))) ==
               (long)((lVar20 - (long)a_02) - (ulong)(uVar9 < -uVar26)) < 0;
    }
    psVar23 = (secp256k1_fe *)(ulong)bVar45;
    if (bVar45 == false) goto LAB_0014768d;
    uVar15 = uVar9 + uVar26;
    lVar42 = lVar20 + lVar19 + (ulong)CARRY8(uVar9,uVar26);
    uVar34 = psVar14->n[3];
    if (uVar34 == 0) {
LAB_00147375:
      a_02 = (secp256k1_fe *)0x8000000000000000;
      uVar26 = (long)psVar30 << 2 | uVar18 >> 0x3e;
      uVar6 = uStack_1f8 * (long)psStack_1b0 + uVar26;
      psVar30 = (secp256k1_fe *)
                (((long)psVar30 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_1f8) * SEXT816((long)psStack_1b0),8) +
                (ulong)CARRY8(uStack_1f8 * (long)psStack_1b0,uVar26));
      uVar9 = (long)psStack_1f0 * (long)psStack_1b8;
      lVar21 = SUB168(SEXT816((long)psStack_1f0) * SEXT816((long)psStack_1b8),8);
      uVar26 = (ulong)(-uVar9 - 1 < uVar6);
      lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
      lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar9 != 0);
      lVar20 = (long)psVar30 - lVar37;
      psStack_1d0->n[2] = uVar18 & 0x3fffffffffffffff;
      a_01->n[2] = uVar15 & 0x3fffffffffffffff;
      bVar45 = (SBORROW8((long)psVar30,lVar37) != SBORROW8(lVar20,(ulong)(uVar6 < -uVar9))) ==
               (long)(lVar20 - (ulong)(uVar6 < -uVar9)) < 0;
      psVar23 = (secp256k1_fe *)(ulong)bVar45;
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
               (long)(lVar19 - uVar26) < 0;
      if (lVar21 < 0) {
        bVar46 = bVar45;
      }
      psVar16 = psStack_1b8;
      psVar24 = psStack_1b0;
      if (!bVar46) goto LAB_00147692;
      uVar15 = uVar15 >> 0x3e | lVar42 << 2;
      uVar18 = uVar6 + uVar9;
      psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)CARRY8(uVar6,uVar9) + lVar21);
      uVar9 = uStack_208 * (long)psStack_1b0 + uVar15;
      lVar21 = SUB168(SEXT816((long)uStack_208) * SEXT816((long)psStack_1b0),8) + (lVar42 >> 0x3e) +
               (ulong)CARRY8(uStack_208 * (long)psStack_1b0,uVar15);
      uVar26 = (long)psStack_200 * (long)psStack_1b8;
      lVar20 = SUB168(SEXT816((long)psStack_200) * SEXT816((long)psStack_1b8),8);
      uVar15 = (ulong)(-uVar26 - 1 < uVar9);
      lVar42 = (0x7fffffffffffffff - lVar20) - lVar21;
      lVar37 = (-0x8000000000000000 - lVar20) - (ulong)(uVar26 != 0);
      lVar19 = lVar21 - lVar37;
      bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar42,uVar15)) ==
               (long)(lVar42 - uVar15) < 0;
      if (lVar20 < 0) {
        bVar45 = (SBORROW8(lVar21,lVar37) != SBORROW8(lVar19,(ulong)(uVar9 < -uVar26))) ==
                 (long)(lVar19 - (ulong)(uVar9 < -uVar26)) < 0;
      }
      psVar23 = (secp256k1_fe *)(ulong)bVar45;
      if (bVar45 == false) goto LAB_00147697;
      uVar6 = uVar9 + uVar26;
      lVar19 = lVar21 + lVar20 + (ulong)CARRY8(uVar9,uVar26);
      uVar34 = psVar14->n[4];
      uVar26 = uVar34 * lStack_1e0;
      psVar23 = SUB168(SEXT816((long)uVar34) * SEXT816(lStack_1e0),8);
      uVar15 = (ulong)(-uVar26 - 1 < uVar18);
      lVar42 = (0x7fffffffffffffff - (long)psVar23) - (long)psVar30;
      psVar43 = (secp256k1_fe *)((-0x8000000000000000 - (long)psVar23) - (ulong)(uVar26 != 0));
      bVar45 = (SBORROW8(0x7fffffffffffffff - (long)psVar23,(long)psVar30) !=
               SBORROW8(lVar42,uVar15)) == (long)(lVar42 - uVar15) < 0;
      if ((long)psVar23 < 0) {
        bVar45 = (SBORROW8((long)psVar30,(long)psVar43) !=
                 SBORROW8((long)psVar30 - (long)psVar43,(ulong)(uVar18 < -uVar26))) ==
                 (long)(((long)psVar30 - (long)psVar43) - (ulong)(uVar18 < -uVar26)) < 0;
      }
      if (!bVar45) goto LAB_0014769c;
      uVar9 = uVar34 * (long)psVar35;
      lVar20 = SUB168(SEXT816((long)uVar34) * SEXT816((long)psVar35),8);
      psVar24 = (secp256k1_fe *)0x8000000000000000;
      uVar15 = (ulong)(-uVar9 - 1 < uVar6);
      lVar42 = (0x7fffffffffffffff - lVar20) - lVar19;
      a_02 = (secp256k1_fe *)((-0x8000000000000000 - lVar20) - (ulong)(uVar9 != 0));
      bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar42,uVar15)) ==
               (long)(lVar42 - uVar15) < 0;
      if (lVar20 < 0) {
        bVar45 = (SBORROW8(lVar19,(long)a_02) !=
                 SBORROW8(lVar19 - (long)a_02,(ulong)(uVar6 < -uVar9))) ==
                 (long)((lVar19 - (long)a_02) - (ulong)(uVar6 < -uVar9)) < 0;
      }
      psVar16 = (secp256k1_fe *)(ulong)bVar45;
      if (bVar45 == false) goto LAB_001476a1;
      puVar36 = (undefined1 *)
                ((long)psVar30->n + (long)((ulong)CARRY8(uVar26,uVar18) + (long)psVar23->n));
      lVar42 = lVar20 + lVar19 + (ulong)CARRY8(uVar9,uVar6);
      psVar16 = (secp256k1_fe *)((long)puVar36 * 4 | uVar26 + uVar18 >> 0x3e);
      psStack_1d0->n[3] = uVar26 + uVar18 & 0x3fffffffffffffff;
      a_01->n[3] = uVar9 + uVar6 & 0x3fffffffffffffff;
      psVar30 = (secp256k1_fe *)(psVar16[0x2aaaaaaaaaaaaaa].n + 2);
      psVar23 = (secp256k1_fe *)
                (((long)puVar36 >> 0x3e) + -1 +
                (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar16));
      if (psVar23 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_001476a6;
      psVar23 = (secp256k1_fe *)0xffffffffffffffff;
      uVar15 = uVar9 + uVar6 >> 0x3e | lVar42 * 4;
      psStack_1d0->n[4] = (uint64_t)psVar16;
      psVar24 = (secp256k1_fe *)(uVar15 + 0x8000000000000000);
      if ((lVar42 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar15) != -1) goto LAB_001476ab;
      a_01->n[4] = uVar15;
      psVar23 = (secp256k1_fe *)0x5;
      psVar16 = (secp256k1_fe *)0xfffffffffffffffe;
      psStack_210 = (secp256k1_fe *)0x1475c5;
      psVar30 = psStack_1d0;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psStack_1d0,5,
                         (secp256k1_modinv64_signed62 *)psVar14,-2);
      if (iVar4 < 1) goto LAB_001476b0;
      psVar16 = (secp256k1_fe *)0x1;
      psVar23 = (secp256k1_fe *)0x5;
      psStack_210 = (secp256k1_fe *)0x1475e2;
      psVar30 = psVar29;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar29,5,
                         (secp256k1_modinv64_signed62 *)psVar14,1);
      if (-1 < iVar4) goto LAB_001476b5;
      psVar23 = (secp256k1_fe *)0x5;
      psVar16 = (secp256k1_fe *)0xfffffffffffffffe;
      psStack_210 = (secp256k1_fe *)0x147601;
      psVar30 = a_01;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,
                         (secp256k1_modinv64_signed62 *)psVar14,-2);
      if (iVar4 < 1) goto LAB_001476ba;
      psVar16 = (secp256k1_fe *)0x1;
      psVar23 = (secp256k1_fe *)0x5;
      psStack_210 = (secp256k1_fe *)0x14761e;
      psVar30 = a_01;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,
                         (secp256k1_modinv64_signed62 *)psVar14,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_001476bf;
    }
    psVar24 = (secp256k1_fe *)(uVar34 * lStack_1e0);
    lVar20 = SUB168(SEXT816((long)uVar34) * SEXT816(lStack_1e0),8);
    uVar26 = (ulong)(-(long)psVar24 - 1U < uVar18);
    lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
    a_02 = (secp256k1_fe *)0x8000000000000000;
    psVar23 = (secp256k1_fe *)
              ((-0x8000000000000000 - lVar20) - (ulong)(psVar24 != (secp256k1_fe *)0x0));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar26)) ==
             (long)(lVar19 - uVar26) < 0;
    if (lVar20 < 0) {
      bVar45 = (SBORROW8((long)psVar30,(long)psVar23) !=
               SBORROW8((long)psVar30 - (long)psVar23,(ulong)(uVar18 < (ulong)-(long)psVar24))) ==
               (long)(((long)psVar30 - (long)psVar23) - (ulong)(uVar18 < (ulong)-(long)psVar24)) < 0
      ;
    }
    psVar44 = psStack_1d0;
    if (!bVar45) goto LAB_001476d8;
    uVar9 = uVar34 * (long)psVar35;
    lVar37 = SUB168(SEXT816((long)uVar34) * SEXT816((long)psVar35),8);
    uVar26 = (ulong)(-uVar9 - 1 < uVar15);
    lVar19 = (0x7fffffffffffffff - lVar37) - lVar42;
    lVar41 = (-0x8000000000000000 - lVar37) - (ulong)(uVar9 != 0);
    lVar21 = lVar42 - lVar41;
    psVar44 = (secp256k1_fe *)(lVar21 - (ulong)(uVar15 < -uVar9));
    bVar45 = (SBORROW8(0x7fffffffffffffff - lVar37,lVar42) != SBORROW8(lVar19,uVar26)) ==
             (long)(lVar19 - uVar26) < 0;
    if (lVar37 < 0) {
      bVar45 = (SBORROW8(lVar42,lVar41) != SBORROW8(lVar21,(ulong)(uVar15 < -uVar9))) ==
               (long)psVar44 < 0;
    }
    uVar17 = (uint)bVar45;
    if (bVar45 != false) {
      bVar45 = CARRY8(uVar18,(ulong)psVar24);
      uVar18 = (long)psVar24->n + uVar18;
      psVar30 = (secp256k1_fe *)((long)psVar30->n + (ulong)bVar45 + lVar20);
      bVar45 = CARRY8(uVar15,uVar9);
      uVar15 = uVar15 + uVar9;
      lVar42 = lVar42 + lVar37 + (ulong)bVar45;
      goto LAB_00147375;
    }
  }
  psStack_210 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_03 = &sStack_270;
  psStack_220 = psVar24;
  psStack_218 = a_02;
  psStack_210 = psVar44;
  secp256k1_modinv64_mul_62(&sStack_248,(secp256k1_modinv64_signed62 *)psVar30,uVar17,1);
  psVar27 = a_00;
  secp256k1_modinv64_mul_62(&sStack_270,a_00,5,(int64_t)psVar35);
  lVar42 = 0;
  while ((ulong)sStack_248.v[lVar42] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_270.v[lVar42]) goto LAB_00147772;
    lVar42 = lVar42 + 1;
    if (lVar42 == 4) {
      uVar17 = 4;
      while( true ) {
        if (sStack_248.v[uVar17] < sStack_270.v[uVar17]) {
          return;
        }
        if (sStack_270.v[uVar17] < sStack_248.v[uVar17]) break;
        bVar45 = uVar17 == 0;
        uVar17 = uVar17 - 1;
        if (bVar45) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00147772:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)a_03;
  if (iVar4 < 1) {
LAB_00147a31:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00147a36:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00147a3b:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00147a40:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00147a45:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00147a4a:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar34 = psVar35->n[0];
    uVar1 = psVar35->n[1];
    lVar42 = psVar27->v[0];
    lVar19 = *extraout_RDX_00;
    uVar15 = lVar42 * uVar34;
    lVar21 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar34),8);
    uVar26 = lVar19 * uVar1;
    lVar37 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar1),8);
    lVar20 = (0x7fffffffffffffff - lVar37) - lVar21;
    if (-1 < lVar37 &&
        (SBORROW8(0x7fffffffffffffff - lVar37,lVar21) != SBORROW8(lVar20,(ulong)(~uVar26 < uVar15)))
        != (long)(lVar20 - (ulong)(~uVar26 < uVar15)) < 0) goto LAB_00147a36;
    uVar2 = psVar35->n[2];
    lVar21 = lVar37 + lVar21 + (ulong)CARRY8(uVar26,uVar15);
    uVar3 = psVar35->n[3];
    uVar6 = lVar42 * uVar2;
    lVar20 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar2),8);
    uVar18 = lVar19 * uVar3;
    lVar19 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar3),8);
    uVar9 = (ulong)(-uVar18 - 1 < uVar6);
    lVar42 = (0x7fffffffffffffff - lVar19) - lVar20;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar42,uVar9)) !=
        (long)(lVar42 - uVar9) < 0) goto LAB_00147a3b;
    lVar42 = lVar19 + lVar20 + (ulong)CARRY8(uVar18,uVar6);
    if ((uVar26 + uVar15 & 0x3fffffffffffffff) != 0) goto LAB_00147a40;
    if ((uVar18 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_00147a45;
    uVar9 = uVar18 + uVar6 >> 0x3e | lVar42 * 4;
    uVar15 = uVar26 + uVar15 >> 0x3e | lVar21 * 4;
    lVar42 = lVar42 >> 0x3e;
    lVar21 = lVar21 >> 0x3e;
    if (iVar4 != 1) {
      psVar10 = (secp256k1_modinv64_signed62 *)((ulong)a_03 & 0xffffffff);
      a_03 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar19 = psVar27->v[(long)a_03];
        uVar6 = lVar19 * uVar34 + uVar15;
        lVar25 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar34),8) + lVar21 +
                 (ulong)CARRY8(lVar19 * uVar34,uVar15);
        lVar20 = extraout_RDX_00[(long)a_03];
        uVar26 = lVar20 * uVar1;
        lVar41 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar1),8);
        uVar15 = (ulong)(-uVar26 - 1 < uVar6);
        lVar21 = (0x7fffffffffffffff - lVar41) - lVar25;
        psVar28 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar38 = (-0x8000000000000000 - lVar41) - (ulong)(uVar26 != 0);
        lVar37 = lVar25 - lVar38;
        bVar45 = (SBORROW8(0x7fffffffffffffff - lVar41,lVar25) != SBORROW8(lVar21,uVar15)) ==
                 (long)(lVar21 - uVar15) < 0;
        if (lVar41 < 0) {
          bVar45 = (SBORROW8(lVar25,lVar38) != SBORROW8(lVar37,(ulong)(uVar6 < -uVar26))) ==
                   (long)(lVar37 - (ulong)(uVar6 < -uVar26)) < 0;
        }
        if (!bVar45) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00147a2c:
          psVar27 = psVar28;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00147a31;
        }
        uVar32 = lVar19 * uVar2 + uVar9;
        lVar37 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar2),8) + lVar42 +
                 (ulong)CARRY8(lVar19 * uVar2,uVar9);
        uVar18 = lVar20 * uVar3;
        lVar20 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar3),8);
        uVar15 = (ulong)(-uVar18 - 1 < uVar32);
        lVar42 = (0x7fffffffffffffff - lVar20) - lVar37;
        lVar21 = (-0x8000000000000000 - lVar20) - (ulong)(uVar18 != 0);
        lVar19 = lVar37 - lVar21;
        bVar45 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar37) != SBORROW8(lVar42,uVar15)) ==
                 (long)(lVar42 - uVar15) < 0;
        if (lVar20 < 0) {
          bVar45 = (SBORROW8(lVar37,lVar21) != SBORROW8(lVar19,(ulong)(uVar32 < -uVar18))) ==
                   (long)(lVar19 - (ulong)(uVar32 < -uVar18)) < 0;
        }
        if (!bVar45) goto LAB_00147a2c;
        lVar21 = lVar41 + lVar25 + (ulong)CARRY8(uVar26,uVar6);
        lVar42 = lVar20 + lVar37 + (ulong)CARRY8(uVar18,uVar32);
        uVar15 = lVar21 * 4 | uVar26 + uVar6 >> 0x3e;
        psVar27->v[(long)((long)a_03[-1].v + 0x27)] = uVar26 + uVar6 & 0x3fffffffffffffff;
        uVar9 = lVar42 * 4 | uVar18 + uVar32 >> 0x3e;
        extraout_RDX_00[(long)((long)a_03[-1].v + 0x27)] = uVar18 + uVar32 & 0x3fffffffffffffff;
        a_03 = (secp256k1_modinv64_signed62 *)((long)a_03->v + 1);
        lVar42 = lVar42 >> 0x3e;
        lVar21 = lVar21 >> 0x3e;
      } while (psVar10 != a_03);
    }
    if (lVar21 + -1 + (ulong)(0x7fffffffffffffff < uVar15) != -1) goto LAB_00147a4a;
    psVar27->v[(long)iVar4 + -1] = uVar15;
    if (lVar42 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
      extraout_RDX_00[(long)iVar4 + -1] = uVar9;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar42 = a_03->v[0];
  lVar19 = a_03->v[1];
  lVar20 = a_03->v[2];
  lVar21 = a_03->v[3];
  lVar37 = a_03->v[4];
  lVar41 = 0;
  do {
    if (a_03->v[lVar41] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00147c80:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00147c85;
    }
    if (0x3fffffffffffffff < a_03->v[lVar41]) goto LAB_00147c80;
    lVar41 = lVar41 + 1;
  } while (lVar41 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,-2);
  if (iVar4 < 1) {
LAB_00147c85:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00147c8a:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00147c8f:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
    if (-1 < iVar4) goto LAB_00147c8a;
    uVar15 = lVar37 >> 0x3f;
    uVar6 = (long)psVar27 >> 0x3f;
    uVar26 = ((uVar15 & b->v[0]) + lVar42 ^ uVar6) - uVar6;
    uVar18 = ((long)uVar26 >> 0x3e) + (((uVar15 & b->v[1]) + lVar19 ^ uVar6) - uVar6);
    uVar32 = ((long)uVar18 >> 0x3e) + ((lVar20 + (uVar15 & b->v[2]) ^ uVar6) - uVar6);
    uVar9 = ((long)uVar32 >> 0x3e) + (((uVar15 & b->v[3]) + lVar21 ^ uVar6) - uVar6);
    lVar42 = ((long)uVar9 >> 0x3e) + (((uVar15 & b->v[4]) + lVar37 ^ uVar6) - uVar6);
    uVar6 = lVar42 >> 0x3f;
    uVar15 = (b->v[0] & uVar6) + (uVar26 & 0x3fffffffffffffff);
    uVar18 = ((long)uVar15 >> 0x3e) + (b->v[1] & uVar6) + (uVar18 & 0x3fffffffffffffff);
    uVar26 = ((long)uVar18 >> 0x3e) + (b->v[2] & uVar6) + (uVar32 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar26 >> 0x3e) + (b->v[3] & uVar6) + (uVar9 & 0x3fffffffffffffff);
    uVar6 = (b->v[4] & uVar6) + lVar42 + ((long)uVar9 >> 0x3e);
    a_03->v[0] = uVar15 & 0x3fffffffffffffff;
    a_03->v[1] = uVar18 & 0x3fffffffffffffff;
    a_03->v[2] = uVar26 & 0x3fffffffffffffff;
    a_03->v[3] = uVar9 & 0x3fffffffffffffff;
    a_03->v[4] = uVar6;
    if (0x3fffffffffffffff < uVar6) goto LAB_00147c8f;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00147c99;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00147c99:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe_verify(r);
    secp256k1_fe_verify(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);
    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}